

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_iterator.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::regex_iterator_impl
          (regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 begin,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  next_search,
          basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rex,match_flag_type flags,bool not_null)

{
  nested_results_type *pnVar1;
  _Rb_tree_header *p_Var2;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar3;
  
  (this->
  super_counted_base<boost::xpressive::detail::regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).count_.value_ = 0;
  tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::tracking_ptr((tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&this->rex_,
                 (tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)rex);
  (this->what_).prefix_.super_type.m_initialized = false;
  (this->what_).suffix_.super_type.m_initialized = false;
  pnVar1 = &(this->what_).nested_results_;
  (this->what_).regex_id_ = (regex_id_type)0x0;
  (this->what_).sub_matches_.size_ = 0;
  *(undefined8 *)((long)&(this->what_).sub_matches_.size_ + 1) = 0;
  *(undefined8 *)((long)&(this->what_).sub_matches_.sub_matches_ + 1) = 0;
  (this->what_).nested_results_.
  super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._sentry._prev = (node_base *)pnVar1;
  (this->what_).nested_results_.
  super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._sentry._next = (node_base *)pnVar1;
  p_Var2 = &(this->what_).args_._M_t._M_impl.super__Rb_tree_header;
  (this->what_).extras_ptr_.px =
       (results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (this->what_).traits_.px = (traits<char> *)0x0;
  *(undefined8 *)&(this->what_).args_._M_t._M_impl = 0;
  *(undefined8 *)&(this->what_).args_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->what_).args_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->what_).args_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->what_).args_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->what_).args_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->what_).named_marks_.
  super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->what_).named_marks_.
  super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->what_).named_marks_.
  super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3 = tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::get((tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&this->rex_);
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::match_state(&this->state_,begin,end,&this->what_,psVar3->px,flags);
  this->flags_ = flags;
  this->not_null_ = not_null;
  (this->state_).cur_._M_current = cur._M_current;
  (this->state_).next_search_._M_current = next_search._M_current;
  return;
}

Assistant:

regex_iterator_impl
    (
        BidiIter begin
      , BidiIter cur
      , BidiIter end
      , BidiIter next_search
      , basic_regex<BidiIter> const &rex
      , regex_constants::match_flag_type flags
      , bool not_null = false
    )
      : rex_(rex)
      , what_()
      , state_(begin, end, what_, *access::get_regex_impl(rex_), flags)
      , flags_(flags)
      , not_null_(not_null)
    {
        this->state_.cur_ = cur;
        this->state_.next_search_ = next_search;
    }